

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

FT_F26Dot6 Round_Super(TT_ExecContext exc,FT_F26Dot6 distance,FT_F26Dot6 compensation)

{
  long local_28;
  FT_F26Dot6 val;
  FT_F26Dot6 compensation_local;
  FT_F26Dot6 distance_local;
  TT_ExecContext exc_local;
  
  if (distance < 0) {
    local_28 = -exc->phase -
               (((exc->threshold - exc->phase) + compensation) - distance & -exc->period);
    if (0 < local_28) {
      local_28 = -exc->phase;
    }
  }
  else {
    local_28 = exc->phase + (distance + (exc->threshold - exc->phase) + compensation & -exc->period)
    ;
    if (local_28 < 0) {
      local_28 = exc->phase;
    }
  }
  return local_28;
}

Assistant:

static FT_F26Dot6
  Round_Super( TT_ExecContext  exc,
               FT_F26Dot6      distance,
               FT_F26Dot6      compensation )
  {
    FT_F26Dot6  val;


    if ( distance >= 0 )
    {
      val = ADD_LONG( distance,
                      exc->threshold - exc->phase + compensation ) &
              -exc->period;
      val += exc->phase;
      if ( val < 0 )
        val = exc->phase;
    }
    else
    {
      val = NEG_LONG( SUB_LONG( exc->threshold - exc->phase + compensation,
                                distance ) &
                        -exc->period );
      val -= exc->phase;
      if ( val > 0 )
        val = -exc->phase;
    }

    return val;
  }